

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_TEXLDD(Context *ctx)

{
  if (ctx->profile_supports_nv2 != 0) {
    arb1_texld(ctx,"TXD",1);
    return;
  }
  arb1_texld(ctx,"TEX",0);
  return;
}

Assistant:

static void emit_ARB1_TEXLDD(Context *ctx)
{
    // With GL_NV_fragment_program2, we can use the TXD opcode.
    //  In stock arb1, we can settle for a standard texld, which isn't
    //  perfect, but oh well.
    if (support_nv2(ctx))
        arb1_texld(ctx, "TXD", 1);
    else
        arb1_texld(ctx, "TEX", 0);
}